

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

ly_set * lys_find_path(lys_module *cur_module,lys_node *cur_node,char *path)

{
  int iVar1;
  ly_set *local_10;
  ly_set *ret;
  
  if (path == (char *)0x0 || cur_module == (lys_module *)0x0 && cur_node == (lys_node *)0x0) {
    return (ly_set *)0x0;
  }
  iVar1 = resolve_schema_nodeid(path,cur_node,cur_module,&local_10,1,1);
  if (iVar1 == -1) {
    local_10 = (ly_set *)0x0;
  }
  return local_10;
}

Assistant:

ly_set *
lys_find_path(const struct lys_module *cur_module, const struct lys_node *cur_node, const char *path)
{
    struct ly_set *ret;
    int rc;

    if ((!cur_module && !cur_node) || !path) {
        return NULL;
    }

    rc = resolve_schema_nodeid(path, cur_node, cur_module, &ret, 1, 1);
    if (rc == -1) {
        return NULL;
    }

    return ret;
}